

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

void cmFortranParser_RuleEndif(cmFortranParser *parser)

{
  if ((parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    std::deque<bool,_std::allocator<bool>_>::pop_back(&(parser->SkipToEnd).c);
  }
  if (parser->InPPFalseBranch != 0) {
    parser->InPPFalseBranch = parser->InPPFalseBranch - 1;
  }
  return;
}

Assistant:

void cmFortranParser_RuleEndif(cmFortranParser* parser)
{
  if (!parser->SkipToEnd.empty()) {
    parser->SkipToEnd.pop();
  }

  // #endif doesn't know if there was a "#else" in before, so it
  // always decreases InPPFalseBranch
  if (parser->InPPFalseBranch) {
    parser->InPPFalseBranch--;
  }
}